

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirread.c
# Opt level: O3

void TryChopUpUncompressedBigTiff(TIFF *tif)

{
  TIFFDirEntry *dirent;
  uint64_t **parray;
  TIFFDirEntry *dirent_00;
  uint64_t **parray_00;
  undefined1 auVar1 [16];
  uint uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  toff_t tVar8;
  uint uVar9;
  uint32_t nrows;
  uint rowsperstrip;
  ulong uVar10;
  uint32_t uVar11;
  
  uVar3 = TIFFStripSize64(tif);
  if ((tif->tif_dir).td_planarconfig != 1) {
    __assert_fail("tif->tif_dir.td_planarconfig == PLANARCONFIG_CONTIG",
                  "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_dirread.c"
                  ,0x1cec,"void TryChopUpUncompressedBigTiff(TIFF *)");
  }
  if ((tif->tif_dir).td_compression != 1) {
    __assert_fail("tif->tif_dir.td_compression == COMPRESSION_NONE",
                  "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_dirread.c"
                  ,0x1ced,"void TryChopUpUncompressedBigTiff(TIFF *)");
  }
  if ((tif->tif_flags & 0x8400) != 0x8000) {
    __assert_fail("(tif->tif_flags & (TIFF_STRIPCHOP | TIFF_ISTILED)) == TIFF_STRIPCHOP",
                  "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_dirread.c"
                  ,0x1cef,"void TryChopUpUncompressedBigTiff(TIFF *)");
  }
  if (uVar3 < 0x80000000) {
    __assert_fail("stripsize > 0x7FFFFFFFUL",
                  "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_dirread.c"
                  ,0x1cf0,"void TryChopUpUncompressedBigTiff(TIFF *)");
  }
  dirent = &(tif->tif_dir).td_stripbytecount_entry;
  parray = &(tif->tif_dir).td_stripbytecount_p;
  uVar4 = _TIFFGetStrileOffsetOrByteCountValue(tif,0,dirent,parray,(int *)0x0);
  if ((uVar4 != 0) || (tif->tif_mode == 0)) {
    nrows = 1;
    if (((tif->tif_dir).td_photometric == 6) && ((tif->tif_flags & 0x4000) == 0)) {
      nrows = (uint32_t)(tif->tif_dir).td_ycbcrsubsampling[1];
    }
    uVar4 = TIFFVStripSize64(tif,nrows);
    if (0xffffffff80000000 < uVar4 - 0x80000000) {
      uVar2 = (tif->tif_dir).td_nstrips;
      if (uVar2 == 0) {
        uVar11 = 0xffffffff;
      }
      else {
        dirent_00 = &(tif->tif_dir).td_stripoffset_entry;
        parray_00 = &(tif->tif_dir).td_stripoffset_p;
        uVar11 = 0;
        do {
          uVar5 = _TIFFGetStrileOffsetOrByteCountValue(tif,uVar11,dirent,parray,(int *)0x0);
          if (uVar11 == uVar2 - 1) {
            uVar6 = TIFFVStripSize64(tif,(tif->tif_dir).td_imagelength -
                                         (tif->tif_dir).td_rowsperstrip * uVar11);
            if (uVar5 < uVar6) {
              return;
            }
          }
          else {
            if (uVar5 != uVar3) {
              return;
            }
            if (uVar11 != 0) {
              uVar5 = _TIFFGetStrileOffsetOrByteCountValue
                                (tif,uVar11,dirent_00,parray_00,(int *)0x0);
              uVar6 = _TIFFGetStrileOffsetOrByteCountValue
                                (tif,uVar11 - 1,dirent_00,parray_00,(int *)0x0);
              uVar7 = _TIFFGetStrileOffsetOrByteCountValue(tif,uVar11 - 1,dirent,parray,(int *)0x0);
              if (uVar5 != uVar7 + uVar6) {
                return;
              }
            }
          }
          uVar11 = uVar11 + 1;
          uVar2 = (tif->tif_dir).td_nstrips;
        } while (uVar11 < uVar2);
        uVar11 = uVar2 - 1;
      }
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar4;
      uVar10 = 1;
      if (uVar4 < 0x20000001) {
        uVar10 = (ulong)SUB164((ZEXT816(0) << 0x40 | ZEXT816(0x20000000)) / auVar1,0);
      }
      if ((uVar10 * uVar4 & 0xffffffff80000000) != 0) {
        __assert_fail("stripbytes <= 0x7FFFFFFFUL",
                      "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_dirread.c"
                      ,0x1d24,"void TryChopUpUncompressedBigTiff(TIFF *)");
      }
      rowsperstrip = (int)uVar10 * nrows;
      uVar2 = (tif->tif_dir).td_imagelength;
      if ((uVar2 < -rowsperstrip) &&
         (uVar9 = (rowsperstrip + uVar2) - 1, uVar2 = uVar9 / rowsperstrip, rowsperstrip <= uVar9))
      {
        if ((1000000 < uVar2) && (tif->tif_mode == 0)) {
          uVar3 = _TIFFGetStrileOffsetOrByteCountValue
                            (tif,uVar11,&(tif->tif_dir).td_stripoffset_entry,
                             &(tif->tif_dir).td_stripoffset_p,(int *)0x0);
          tVar8 = (*tif->tif_sizeproc)(tif->tif_clientdata);
          uVar5 = _TIFFGetStrileOffsetOrByteCountValue
                            (tif,(tif->tif_dir).td_nstrips - 1,dirent,parray,(int *)0x0);
          if (tVar8 < uVar3) {
            return;
          }
          if (tVar8 - uVar3 < uVar5) {
            return;
          }
        }
        allocChoppedUpStripArrays(tif,uVar2,uVar10 * uVar4,rowsperstrip);
        return;
      }
    }
  }
  return;
}

Assistant:

static void TryChopUpUncompressedBigTiff(TIFF *tif)
{
    TIFFDirectory *td = &tif->tif_dir;
    uint32_t rowblock;
    uint64_t rowblockbytes;
    uint32_t i;
    uint64_t stripsize;
    uint32_t rowblocksperstrip;
    uint32_t rowsperstrip;
    uint64_t stripbytes;
    uint32_t nstrips;

    stripsize = TIFFStripSize64(tif);

    assert(tif->tif_dir.td_planarconfig == PLANARCONFIG_CONTIG);
    assert(tif->tif_dir.td_compression == COMPRESSION_NONE);
    assert((tif->tif_flags & (TIFF_STRIPCHOP | TIFF_ISTILED)) ==
           TIFF_STRIPCHOP);
    assert(stripsize > 0x7FFFFFFFUL);

    /* On a newly created file, just re-opened to be filled, we */
    /* don't want strip chop to trigger as it is going to cause issues */
    /* later ( StripOffsets and StripByteCounts improperly filled) . */
    if (TIFFGetStrileByteCount(tif, 0) == 0 && tif->tif_mode != O_RDONLY)
        return;

    if ((td->td_photometric == PHOTOMETRIC_YCBCR) && (!isUpSampled(tif)))
        rowblock = td->td_ycbcrsubsampling[1];
    else
        rowblock = 1;
    rowblockbytes = TIFFVStripSize64(tif, rowblock);
    if (rowblockbytes == 0 || rowblockbytes > 0x7FFFFFFFUL)
    {
        /* In case of file with gigantic width */
        return;
    }

    /* Check that the strips are contiguous and of the expected size */
    for (i = 0; i < td->td_nstrips; i++)
    {
        if (i == td->td_nstrips - 1)
        {
            if (TIFFGetStrileByteCount(tif, i) <
                TIFFVStripSize64(tif,
                                 td->td_imagelength - i * td->td_rowsperstrip))
            {
                return;
            }
        }
        else
        {
            if (TIFFGetStrileByteCount(tif, i) != stripsize)
            {
                return;
            }
            if (i > 0 && TIFFGetStrileOffset(tif, i) !=
                             TIFFGetStrileOffset(tif, i - 1) +
                                 TIFFGetStrileByteCount(tif, i - 1))
            {
                return;
            }
        }
    }

    /* Aim for 512 MB strips (that will still be manageable by 32 bit builds */
    rowblocksperstrip = (uint32_t)(512 * 1024 * 1024 / rowblockbytes);
    if (rowblocksperstrip == 0)
        rowblocksperstrip = 1;
    rowsperstrip = rowblocksperstrip * rowblock;
    stripbytes = rowblocksperstrip * rowblockbytes;
    assert(stripbytes <= 0x7FFFFFFFUL);

    nstrips = TIFFhowmany_32(td->td_imagelength, rowsperstrip);
    if (nstrips == 0)
        return;

    /* If we are going to allocate a lot of memory, make sure that the */
    /* file is as big as needed */
    if (tif->tif_mode == O_RDONLY && nstrips > 1000000)
    {
        uint64_t last_offset = TIFFGetStrileOffset(tif, td->td_nstrips - 1);
        uint64_t filesize = TIFFGetFileSize(tif);
        uint64_t last_bytecount =
            TIFFGetStrileByteCount(tif, td->td_nstrips - 1);
        if (last_offset > filesize || last_bytecount > filesize - last_offset)
        {
            return;
        }
    }

    allocChoppedUpStripArrays(tif, nstrips, stripbytes, rowsperstrip);
}